

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# number_patternstring.cpp
# Opt level: O3

void __thiscall
icu_63::number::impl::ParsedPatternInfo::consumeIntegerFormat
          (ParsedPatternInfo *this,UErrorCode *status)

{
  ParserState *this_00;
  undefined4 uVar1;
  undefined4 uVar2;
  ParsedSubpatternInfo *pPVar3;
  uint64_t uVar4;
  bool bVar5;
  UChar32 UVar6;
  uint uVar7;
  UErrorCode UVar8;
  
  pPVar3 = this->currentSubpattern;
  this_00 = &this->state;
  do {
    UVar6 = ParserState::peek(this_00);
    if (UVar6 - 0x30U < 10) {
      if (0 < pPVar3->integerAtSigns) {
LAB_002a9412:
        UVar8 = U_FMT_PARSE_ERROR_START;
        goto LAB_002a9417;
      }
      pPVar3->widthExceptAffixes = pPVar3->widthExceptAffixes + 1;
      pPVar3->groupingSizes = pPVar3->groupingSizes + 1;
      pPVar3->integerNumerals = pPVar3->integerNumerals + 1;
      pPVar3->integerTotal = pPVar3->integerTotal + 1;
      bVar5 = DecimalQuantity::isZero(&pPVar3->rounding);
      if ((!bVar5) || (UVar6 = ParserState::peek(this_00), UVar6 != 0x30)) {
        UVar6 = ParserState::peek(this_00);
        DecimalQuantity::appendDigit(&pPVar3->rounding,(char)UVar6 + -0x30,0,true);
      }
    }
    else if (UVar6 == 0x23) {
      if (0 < pPVar3->integerNumerals) goto LAB_002a9412;
      pPVar3->widthExceptAffixes = pPVar3->widthExceptAffixes + 1;
      pPVar3->groupingSizes = pPVar3->groupingSizes + 1;
      if (pPVar3->integerAtSigns < 1) {
        pPVar3->integerLeadingHashSigns = pPVar3->integerLeadingHashSigns + 1;
      }
      else {
        pPVar3->integerTrailingHashSigns = pPVar3->integerTrailingHashSigns + 1;
      }
      pPVar3->integerTotal = pPVar3->integerTotal + 1;
    }
    else if (UVar6 == 0x40) {
      UVar8 = U_FMT_PARSE_ERROR_START;
      if ((0 < pPVar3->integerNumerals) || (0 < pPVar3->integerTrailingHashSigns))
      goto LAB_002a9417;
      pPVar3->widthExceptAffixes = pPVar3->widthExceptAffixes + 1;
      pPVar3->groupingSizes = pPVar3->groupingSizes + 1;
      uVar1 = pPVar3->integerAtSigns;
      uVar2 = pPVar3->integerTotal;
      pPVar3->integerAtSigns = uVar1 + 1;
      pPVar3->integerTotal = uVar2 + 1;
    }
    else {
      if (UVar6 != 0x2c) {
        uVar4 = pPVar3->groupingSizes;
        UVar8 = U_FMT_PARSE_ERROR_START;
        if (((short)uVar4 == 0 && (uint)uVar4 < 0xffff0000) ||
           (UVar8 = U_PATTERN_SYNTAX_ERROR, (short)(uVar4 >> 0x20) != -1 && (uint)uVar4 < 0x10000))
        {
LAB_002a9417:
          *status = UVar8;
        }
        return;
      }
      pPVar3->widthExceptAffixes = pPVar3->widthExceptAffixes + 1;
      pPVar3->groupingSizes = pPVar3->groupingSizes << 0x10;
    }
    uVar7 = ParserState::peek(this_00);
    (this->state).offset = ((this->state).offset - (uint)(uVar7 < 0x10000)) + 2;
  } while( true );
}

Assistant:

void ParsedPatternInfo::consumeIntegerFormat(UErrorCode& status) {
    // Convenience reference:
    ParsedSubpatternInfo& result = *currentSubpattern;

    while (true) {
        switch (state.peek()) {
            case u',':
                result.widthExceptAffixes += 1;
                result.groupingSizes <<= 16;
                break;

            case u'#':
                if (result.integerNumerals > 0) {
                    state.toParseException(u"# cannot follow 0 before decimal point");
                    status = U_UNEXPECTED_TOKEN;
                    return;
                }
                result.widthExceptAffixes += 1;
                result.groupingSizes += 1;
                if (result.integerAtSigns > 0) {
                    result.integerTrailingHashSigns += 1;
                } else {
                    result.integerLeadingHashSigns += 1;
                }
                result.integerTotal += 1;
                break;

            case u'@':
                if (result.integerNumerals > 0) {
                    state.toParseException(u"Cannot mix 0 and @");
                    status = U_UNEXPECTED_TOKEN;
                    return;
                }
                if (result.integerTrailingHashSigns > 0) {
                    state.toParseException(u"Cannot nest # inside of a run of @");
                    status = U_UNEXPECTED_TOKEN;
                    return;
                }
                result.widthExceptAffixes += 1;
                result.groupingSizes += 1;
                result.integerAtSigns += 1;
                result.integerTotal += 1;
                break;

            case u'0':
            case u'1':
            case u'2':
            case u'3':
            case u'4':
            case u'5':
            case u'6':
            case u'7':
            case u'8':
            case u'9':
                if (result.integerAtSigns > 0) {
                    state.toParseException(u"Cannot mix @ and 0");
                    status = U_UNEXPECTED_TOKEN;
                    return;
                }
                result.widthExceptAffixes += 1;
                result.groupingSizes += 1;
                result.integerNumerals += 1;
                result.integerTotal += 1;
                if (!result.rounding.isZero() || state.peek() != u'0') {
                    result.rounding.appendDigit(static_cast<int8_t>(state.peek() - u'0'), 0, true);
                }
                break;

            default:
                goto after_outer;
        }
        state.next(); // consume the symbol
    }

    after_outer:
    // Disallow patterns with a trailing ',' or with two ',' next to each other
    auto grouping1 = static_cast<int16_t> (result.groupingSizes & 0xffff);
    auto grouping2 = static_cast<int16_t> ((result.groupingSizes >> 16) & 0xffff);
    auto grouping3 = static_cast<int16_t> ((result.groupingSizes >> 32) & 0xffff);
    if (grouping1 == 0 && grouping2 != -1) {
        state.toParseException(u"Trailing grouping separator is invalid");
        status = U_UNEXPECTED_TOKEN;
        return;
    }
    if (grouping2 == 0 && grouping3 != -1) {
        state.toParseException(u"Grouping width of zero is invalid");
        status = U_PATTERN_SYNTAX_ERROR;
        return;
    }
}